

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

BYTE * find_central_dir(FILE *fin)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  int *__ptr;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  EndOfCentralDirectory eod;
  uchar buf [1028];
  undefined1 local_44e [12];
  uint local_442;
  uint local_43e;
  char local_438 [1032];
  
  fseek((FILE *)fin,0,2);
  lVar4 = ftell((FILE *)fin);
  lVar6 = 0xffff;
  if (lVar4 < 0xffff) {
    lVar6 = lVar4;
  }
  if (4 < lVar4) {
    iVar3 = (int)lVar4;
    lVar8 = 4;
    do {
      lVar10 = lVar8 + 0x400;
      lVar8 = lVar6;
      if (lVar10 < lVar6) {
        lVar8 = lVar10;
      }
      uVar7 = (ulong)(uint)(iVar3 - (int)lVar8);
      uVar11 = lVar4 - uVar7;
      if (0x403 < (long)uVar11) {
        uVar11 = 0x404;
      }
      iVar2 = fseek((FILE *)fin,uVar7,0);
      if (iVar2 != 0) {
        return (BYTE *)0x0;
      }
      iVar2 = (int)uVar11;
      sVar5 = fread(local_438,1,uVar11 & 0xffffffff,(FILE *)fin);
      if (sVar5 != (uVar11 & 0xffffffff)) {
        return (BYTE *)0x0;
      }
      if (3 < iVar2) {
        uVar7 = (ulong)(iVar2 - 3);
        lVar9 = 0;
        do {
          if ((((local_438[lVar9 + (ulong)(iVar2 - 4)] == 'P') && (local_438[lVar9 + uVar7] == 'K'))
              && (local_438[lVar9 + uVar7 + 1] == '\x05')) &&
             (local_438[lVar9 + uVar7 + 2] == '\x06')) {
            if ((int)lVar9 + ((iVar3 + -4 + iVar2) - (int)lVar8) != 0) {
              if (lVar4 < lVar10) {
                lVar10 = lVar4;
              }
              if (0xfffe < lVar10) {
                lVar10 = 0xffff;
              }
              lVar4 = lVar4 - (ulong)(uint)(iVar3 - (int)lVar10);
              if (0x403 < lVar4) {
                lVar4 = 0x404;
              }
              iVar3 = fseek((FILE *)fin,
                            (ulong)(((((int)lVar4 + iVar3) - (int)lVar10) + (int)lVar9) - 4),0);
              if (iVar3 != 0) {
                return (BYTE *)0x0;
              }
              sVar5 = fread(local_44e,0x16,1,(FILE *)fin);
              if (sVar5 != 1) {
                return (BYTE *)0x0;
              }
              iVar3 = fseek((FILE *)fin,(ulong)local_43e,0);
              if (iVar3 == 0) {
                uVar7 = (ulong)local_442;
                __ptr = (int *)malloc((ulong)(local_442 + 4));
                if (__ptr == (int *)0x0) {
                  no_mem = 1;
                  return (BYTE *)0x0;
                }
                sVar5 = fread(__ptr,1,uVar7,(FILE *)fin);
                if ((sVar5 == uVar7) && (*__ptr == 0x2014b50)) {
                  *(undefined4 *)((long)__ptr + uVar7) = 0x6054b50;
                  return (BYTE *)__ptr;
                }
                free(__ptr);
                return (BYTE *)0x0;
              }
              return (BYTE *)0x0;
            }
            break;
          }
          lVar1 = (ulong)(iVar2 - 4) + lVar9;
          lVar9 = lVar9 + -1;
        } while (0 < lVar1);
      }
    } while (lVar10 < lVar6);
  }
  return (BYTE *)0x0;
}

Assistant:

BYTE *find_central_dir(FILE *fin)
{
	unsigned char buf[BUFREADCOMMENT + 4];
	EndOfCentralDirectory eod;
	BYTE *dir;
	long file_size;
	long back_read;
	long max_back;		// maximum size of global comment
	long pos_found = 0;

	fseek(fin, 0, SEEK_END);

	file_size = ftell(fin);
	max_back = 0xffff > file_size ? file_size : 0xffff;

	back_read = 4;
	while (back_read < max_back)
	{
		UINT32 read_size, read_pos;
		int i;
		if (back_read + BUFREADCOMMENT > max_back) 
			back_read = max_back;
		else
			back_read += BUFREADCOMMENT;
		read_pos = file_size - back_read;

		read_size = (BUFREADCOMMENT + 4) < (file_size - read_pos) ?
					(BUFREADCOMMENT + 4) : (file_size - read_pos);

		if (fseek(fin, read_pos, SEEK_SET) != 0)
			return NULL;

		if (fread(buf, 1, read_size, fin) != read_size)
			return NULL;

		for (i = (int)read_size - 3; (i--) > 0;)
		{
			if (buf[i] == 'P' && buf[i+1] == 'K' && buf[i+2] == 5 && buf[i+3] == 6)
			{
				pos_found = read_pos + i;
				break;
			}
		}

		if (pos_found != 0)
			break;
	}
	if (pos_found == 0 ||
		fseek(fin, pos_found, SEEK_SET) != 0 ||
		fread(&eod, sizeof(eod), 1, fin) != 1 ||
		fseek(fin, LittleLong(eod.DirectoryOffset), SEEK_SET) != 0)
	{
		return NULL;
	}
	dir = malloc(LittleLong(eod.DirectorySize) + 4);
	if (dir == NULL)
	{
		no_mem = 1;
		return NULL;
	}
	if (fread(dir, 1, LittleLong(eod.DirectorySize), fin) != LittleLong(eod.DirectorySize))
	{
		free(dir);
		return NULL;
	}
	if (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) != 0)
	{
		free(dir);
		return NULL;
	}
	memcpy(dir + LittleLong(eod.DirectorySize), (const BYTE *)&endofdir, sizeof(UINT32));
	return dir;
}